

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_function_createPrimitive
          (sysbvm_context_t *context,size_t argumentCount,sysbvm_bitflags_t flags,void *userdata,
          sysbvm_functionEntryPoint_t entryPoint)

{
  sysbvm_object_tuple_t *psVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).functionType,0xc);
  if (argumentCount + 0x800000000000000 >> 0x3c == 0) {
    sVar3 = argumentCount << 4 | 0xb;
  }
  else {
    sVar3 = sysbvm_tuple_uint64_encodeBig(context,argumentCount);
  }
  psVar1[2].header.field_0.typePointer = sVar3;
  psVar1[1].field_1.pointers[0] = flags << 4 | 0xb;
  psVar1[3].header.identityHashAndFlags = 9;
  psVar1[3].header.objectSize = 0;
  if (userdata == (void *)0x0) {
    sysbvm_primitiveTable_ensureIsComputed();
    uVar2 = 0x10;
    for (uVar4 = 0; sysbvm_primitiveTableSize != uVar4; uVar4 = uVar4 + 1) {
      if (*(sysbvm_functionEntryPoint_t *)((long)&sysbvm_primitiveTableSize + uVar2) == entryPoint)
      {
        if (sysbvm_primitiveTableSize <= uVar4) {
          return (sysbvm_tuple_t)psVar1;
        }
        uVar4 = uVar2 & 0xffffffff0 | 9;
        psVar1[3].header.identityHashAndFlags = (int)uVar4;
        psVar1[3].header.objectSize = (int)(uVar4 >> 0x20);
        if (*(char **)(uVar2 + 0x16e1e8) == (char *)0x0) {
          return (sysbvm_tuple_t)psVar1;
        }
        sVar3 = sysbvm_symbol_internWithCString(context,*(char **)(uVar2 + 0x16e1e8));
        psVar1[3].field_1.pointers[0] = sVar3;
        return (sysbvm_tuple_t)psVar1;
      }
      uVar2 = uVar2 + 0x10;
    }
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_function_createPrimitive(sysbvm_context_t *context, size_t argumentCount, sysbvm_bitflags_t flags, void *userdata, sysbvm_functionEntryPoint_t entryPoint)
{
    sysbvm_function_t *result = (sysbvm_function_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_function_t));
    result->argumentCount = sysbvm_tuple_size_encode(context, argumentCount);
    result->flags = sysbvm_tuple_bitflags_encode(flags);
    result->primitiveTableIndex = sysbvm_tuple_uint32_encode(context, 0);
    uint32_t primitiveEntryIndex = 0;
    if(!userdata && sysbvm_primitiveTable_findEntryFor(entryPoint, &primitiveEntryIndex))
    {
        result->primitiveTableIndex = sysbvm_tuple_uint32_encode(context, primitiveEntryIndex + 1);
        const char *primitiveName = sysbvm_primitiveTable[primitiveEntryIndex].name;
        if(primitiveName)
            result->primitiveName = sysbvm_symbol_internWithCString(context, primitiveName);
    }
    return (sysbvm_tuple_t)result;
}